

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.c
# Opt level: O3

int gdLayerMultiply(int dst,int src)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  
  uVar1 = ~dst;
  uVar2 = ~src;
  uVar4 = (uint)src >> 0x18 & 0x7f;
  uVar5 = (uint)dst >> 0x18 & 0x7f;
  uVar6 = uVar4 ^ 0x7f;
  uVar3 = uVar5 ^ 0x7f;
  return (((0xff - ((uVar1 & 0xff) * uVar3) / 0x7f) * (0xff - ((uVar2 & 0xff) * uVar6) / 0x7f) &
          0xffff) / 0xff | uVar5 * uVar4 * 0x20410 & 0xff000000) +
         (((0xff - ((uVar1 >> 0x10 & 0xff) * uVar3) / 0x7f) *
           (0xff - ((uVar2 >> 0x10 & 0xff) * uVar6) / 0x7f) & 0xffff) * 0x8081 >> 7 & 0x1ff0000) +
         (((0xff - ((uVar1 >> 8 & 0xff) * uVar3) / 0x7f) *
           (0xff - ((uVar2 >> 8 & 0xff) * uVar6) / 0x7f) & 0xffff) * 0x8081 >> 0xf & 0x1ff00);
}

Assistant:

BGD_DECLARE(int) gdLayerMultiply (int dst, int src)
{
	int a1, a2, r1, r2, g1, g2, b1, b2;
	a1 = gdAlphaMax - gdTrueColorGetAlpha(src);
	a2 = gdAlphaMax - gdTrueColorGetAlpha(dst);

	r1 = gdRedMax - (a1 * (gdRedMax - gdTrueColorGetRed(src))) / gdAlphaMax;
	r2 = gdRedMax - (a2 * (gdRedMax - gdTrueColorGetRed(dst))) / gdAlphaMax;
	g1 = gdGreenMax - (a1 * (gdGreenMax - gdTrueColorGetGreen(src))) / gdAlphaMax;
	g2 = gdGreenMax - (a2 * (gdGreenMax - gdTrueColorGetGreen(dst))) / gdAlphaMax;
	b1 = gdBlueMax - (a1 * (gdBlueMax - gdTrueColorGetBlue(src))) / gdAlphaMax;
	b2 = gdBlueMax - (a2 * (gdBlueMax - gdTrueColorGetBlue(dst))) / gdAlphaMax ;

	a1 = gdAlphaMax - a1;
	a2 = gdAlphaMax - a2;
	return ( ((a1*a2/gdAlphaMax) << 24) +
			 ((r1*r2/gdRedMax) << 16) +
			 ((g1*g2/gdGreenMax) << 8) +
			 ((b1*b2/gdBlueMax))
		);
}